

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api.cpp
# Opt level: O2

void __thiscall VpulibDlsym::VpulibDlsym(VpulibDlsym *this)

{
  void *pvVar1;
  _func_RK_S32_VpuCodecContext_ptr_ptr *p_Var2;
  long lVar3;
  
  this->rkvpu_close_cxt = (_func_RK_S32_VpuCodecContext_ptr_ptr *)0x0;
  this->rkapi_hdl = (void *)0x0;
  this->rkvpu_open_cxt = (_func_RK_S32_VpuCodecContext_ptr_ptr *)0x0;
  lVar3 = 0;
  do {
    if (lVar3 == 4) {
      return;
    }
    pvVar1 = (void *)dlopen(codec_paths[lVar3],0x101);
    this->rkapi_hdl = pvVar1;
    lVar3 = lVar3 + 1;
  } while (pvVar1 == (void *)0x0);
  p_Var2 = (_func_RK_S32_VpuCodecContext_ptr_ptr *)dlsym(pvVar1,"vpu_open_context");
  this->rkvpu_open_cxt = p_Var2;
  p_Var2 = (_func_RK_S32_VpuCodecContext_ptr_ptr *)dlsym(this->rkapi_hdl,"vpu_close_context");
  this->rkvpu_close_cxt = p_Var2;
  _mpp_log_l(4,"vpu_api","dlopen vpu lib %s success\n",0,
             (&__do_global_dtors_aux_fini_array_entry)[lVar3]);
  return;
}

Assistant:

VpulibDlsym() :
        rkapi_hdl(NULL),
        rkvpu_open_cxt(NULL),
        rkvpu_close_cxt(NULL) {
        RK_U32 i;

        for (i = 0; i < MPP_ARRAY_ELEMS(codec_paths); i++) {
            rkapi_hdl = dlopen(codec_paths[i], RTLD_LAZY | RTLD_GLOBAL);
            if (rkapi_hdl)
                break;
        }

        if (rkapi_hdl) {
            rkvpu_open_cxt  = (RK_S32 (*)(VpuCodecContext **ctx))
                              dlsym(rkapi_hdl, "vpu_open_context");
            rkvpu_close_cxt = (RK_S32 (*)(VpuCodecContext **ctx))
                              dlsym(rkapi_hdl, "vpu_close_context");
            mpp_log("dlopen vpu lib %s success\n", codec_paths[i]);
        }
    }